

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

float protobuf_test_messages_proto2_TestAllTypesProto2_optional_float
                (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  bool bVar1;
  float ret;
  float default_val;
  upb_MiniTableField field;
  float local_28 [2];
  float local_20 [2];
  upb_MiniTableField local_18;
  
  local_20[0] = 0.0;
  local_18.number_dont_copy_me__upb_internal_use_only = 0xb;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x28;
  local_18.presence = 0x4a;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x02';
  local_18.mode_dont_copy_me__upb_internal_use_only = 'B';
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20[0];
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28[0];
}

Assistant:

UPB_INLINE float protobuf_test_messages_proto2_TestAllTypesProto2_optional_float(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  float default_val = 0;
  float ret;
  const upb_MiniTableField field = {11, 40, 74, kUpb_NoSub, 2, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}